

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O3

int cssx(double *inp,int N,double *xreg,int optmethod,int p,int d,int q,int s,int P,int D,int Q,
        double *phi,double *theta,double *PHI,double *THETA,double *exog,int r,double *wmean,
        double *var,double *loglik,double *hess,int start,int imean)

{
  size_t __size;
  double dVar1;
  uint uVar2;
  uint uVar3;
  double *oup;
  double *oup_00;
  double *__dest;
  double *A;
  reg_object obj;
  double *pdVar4;
  double *pdVar5;
  xlik_css_object __ptr;
  double *pdVar6;
  double *dx;
  int *ipiv;
  void *pvVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  int N_00;
  long lVar14;
  size_t sVar15;
  ulong uVar16;
  int iVar17;
  undefined1 local_e8 [8];
  custom_function css_min;
  void *local_b8;
  void *local_b0;
  ulong local_60;
  
  uVar8 = (ulong)(uint)p;
  iVar17 = N - D * s;
  lVar12 = (long)iVar17;
  oup = (double *)malloc(lVar12 * 8);
  uVar3 = 0;
  if (xreg != (double *)0x0) {
    uVar3 = r;
  }
  if (start == 0) {
    if (0 < p) {
      memset(phi,0,uVar8 << 3);
    }
    if (0 < q) {
      memset(theta + p,0,(ulong)(uint)q << 3);
    }
    if (0 < P) {
      uVar10 = 0;
      do {
        PHI[(long)(q + p) + uVar10] = 0.0;
        uVar10 = uVar10 + 1;
      } while ((uint)P != uVar10);
    }
    if (0 < Q) {
      uVar10 = 0;
      do {
        THETA[(long)(q + p + P) + uVar10] = 0.0;
        uVar10 = uVar10 + 1;
      } while ((uint)Q != uVar10);
    }
  }
  if (D < 1) {
    local_60 = (ulong)(uint)N;
    if (0 < N) {
      local_60 = (ulong)(uint)N;
      memcpy(oup,inp,local_60 << 3);
    }
  }
  else {
    uVar2 = diffs(inp,N,D,s,oup);
    local_60 = (ulong)uVar2;
  }
  iVar9 = (int)local_60;
  oup_00 = (double *)malloc((long)(iVar9 - d) << 3);
  if (d < 1) {
    if (0 < iVar9) {
      memcpy(oup_00,oup,local_60 << 3);
    }
  }
  else {
    uVar2 = diff(oup,iVar9,d,oup_00);
    local_60 = (ulong)uVar2;
  }
  lVar14 = (long)N;
  lVar13 = lVar14 * 8;
  __dest = (double *)malloc(lVar13 * (r + 1));
  iVar9 = -D;
  if (imean != 1 || iVar9 != d) {
    if ((int)uVar3 < 1) {
      uVar10 = (ulong)uVar3;
    }
    else {
      memcpy(__dest,xreg,(ulong)uVar3 * lVar13);
      uVar10 = (ulong)(uint)r;
    }
  }
  else {
    if (0 < N) {
      uVar10 = 0;
      do {
        __dest[uVar10] = 1.0;
        uVar10 = uVar10 + 1;
      } while ((uint)N != uVar10);
    }
    if (0 < r) {
      memcpy(__dest + lVar14,xreg,(ulong)(uint)r * lVar13);
    }
    uVar10 = (ulong)(uVar3 + 1);
  }
  sVar15 = (long)(int)local_60 * 8;
  A = (double *)malloc((long)(r + 1) * sVar15);
  N_00 = (int)uVar10;
  if (0 < N_00) {
    pdVar4 = A;
    pdVar5 = __dest;
    uVar16 = uVar10;
    pdVar6 = __dest;
    iVar11 = N;
    if (0 < D) {
      do {
        diffs(pdVar6,N,D,s,pdVar4);
        memcpy(pdVar5,pdVar4,lVar12 * 8);
        uVar16 = uVar16 - 1;
        pdVar4 = pdVar4 + lVar12;
        pdVar5 = pdVar5 + lVar12;
        pdVar6 = pdVar6 + lVar14;
        iVar11 = iVar17;
      } while (uVar16 != 0);
    }
    if (0 < d) {
      pdVar4 = __dest;
      uVar16 = uVar10;
      pdVar5 = A;
      do {
        diff(pdVar4,iVar11,d,pdVar5);
        pdVar5 = pdVar5 + (int)local_60;
        pdVar4 = pdVar4 + iVar11;
        uVar16 = uVar16 - 1;
      } while (uVar16 != 0);
    }
    if (iVar9 == d) {
      memcpy(A,__dest,uVar10 * sVar15);
    }
    iVar17 = rank(A,(int)local_60,N_00);
    if (iVar17 < N_00) {
      puts("Exogenous Variables are collinear. ");
      free(oup);
      free(__dest);
      free(A);
      free(oup_00);
      return 7;
    }
    obj = reg_init((int)local_60,N_00);
    __size = uVar10 * 8;
    pdVar4 = (double *)malloc(__size * uVar10);
    pdVar5 = (double *)malloc(sVar15);
    local_b0 = malloc(__size);
    local_b8 = malloc(__size);
    lVar12 = 0;
    setIntercept(obj,0);
    regress(obj,A,oup_00,pdVar5,pdVar4,0.95);
    uVar16 = uVar10;
    do {
      *(undefined8 *)((long)local_b0 + lVar12) =
           *(undefined8 *)((long)&obj->beta[0].value + lVar12 * 4);
      *(double *)((long)local_b8 + lVar12) =
           *(double *)((long)&obj->beta[0].stdErr + lVar12 * 4) * 10.0;
      lVar12 = lVar12 + 8;
      uVar16 = uVar16 - 1;
    } while (uVar16 != 0);
    free(pdVar4);
    free(pdVar5);
    free_reg(obj);
  }
  __ptr = xlik_css_init(p,d,q,s,P,D,Q,N_00,(int)local_60);
  iVar17 = __ptr->pq;
  lVar12 = (long)iVar17;
  sVar15 = lVar12 * 8;
  pdVar4 = (double *)malloc(sVar15);
  pdVar5 = (double *)malloc(sVar15);
  pdVar6 = (double *)malloc(sVar15 * lVar12);
  dx = (double *)malloc(sVar15);
  ipiv = (int *)malloc(lVar12 * 4);
  __ptr->N = (int)local_60;
  iVar11 = __ptr->offset;
  if (0 < p) {
    memcpy(pdVar4,phi,uVar8 * 8);
  }
  if (0 < q) {
    uVar16 = 0;
    do {
      pdVar4[(long)p + uVar16] = -theta[uVar16];
      uVar16 = uVar16 + 1;
    } while ((uint)q != uVar16);
  }
  if (0 < P) {
    uVar16 = 0;
    do {
      pdVar4[(long)(q + p) + uVar16] = PHI[uVar16];
      uVar16 = uVar16 + 1;
    } while ((uint)P != uVar16);
  }
  css_min.params = (void *)(ulong)(uint)Q;
  if (0 < Q) {
    pvVar7 = (void *)0x0;
    do {
      pdVar4[(long)(q + p + P) + (long)pvVar7] = -THETA[(long)pvVar7];
      pvVar7 = (void *)((long)pvVar7 + 1);
    } while (css_min.params != pvVar7);
  }
  if (N_00 < 1) {
    __ptr->mean = 0.0;
  }
  else {
    uVar16 = 0;
    do {
      pdVar4[(long)(q + p + P + Q) + uVar16] = *(double *)((long)local_b0 + uVar16 * 8);
      uVar16 = uVar16 + 1;
    } while (uVar10 != uVar16);
  }
  if (0 < (int)local_60) {
    uVar16 = 0;
    do {
      dVar1 = oup_00[uVar16];
      __ptr->x[(long)(iVar11 + (int)local_60 * 2) + uVar16] = dVar1;
      __ptr->x[(long)iVar11 + uVar16] = dVar1;
      uVar16 = uVar16 + 1;
    } while (local_60 != uVar16);
  }
  if (SBORROW4((int)local_60,(int)local_60 * 2) != 0 < (int)local_60) {
    memset(__ptr->x + ((int)local_60 + iVar11),0,(ulong)((int)local_60 - 1) * 8 + 8);
  }
  if ((0 < N_00) && ((int)local_60 * 3 < (N_00 + 3) * (int)local_60)) {
    memcpy(__ptr->x + (iVar11 + (int)local_60 * 3),A,(ulong)((int)local_60 * N_00 - 1) * 8 + 8);
  }
  local_e8 = (undefined1  [8])fcssx;
  css_min.funcpt = (_func_double_double_ptr_int_void_ptr *)__ptr;
  uVar3 = fminunc((custom_function *)local_e8,(custom_gradient *)0x0,iVar17,pdVar4,1.0,optmethod,
                  pdVar5);
  if ((0xf < uVar3) || ((0x8011U >> (uVar3 & 0x1f) & 1) == 0)) {
    uVar3 = 1;
  }
  uVar2 = iVar17 - N_00;
  if (uVar2 != 0 && N_00 <= iVar17) {
    uVar16 = 0;
    do {
      dx[uVar16] = 1.0;
      uVar16 = uVar16 + 1;
    } while (uVar2 != uVar16);
  }
  if (0 < N_00) {
    uVar16 = 0;
    do {
      dx[(long)(int)uVar2 + uVar16] = *(double *)((long)local_b8 + uVar16 * 8);
      uVar16 = uVar16 + 1;
    } while (uVar10 != uVar16);
  }
  hessian_fd((custom_function *)local_e8,pdVar5,iVar17,dx,__ptr->eps,hess);
  mtranspose(hess,iVar17,iVar17,pdVar6);
  if (iVar17 != 0) {
    uVar16 = 0;
    do {
      pdVar6[uVar16] = (hess[uVar16] + pdVar6[uVar16]) * (double)((int)local_60 - (D * s + d)) * 0.5
      ;
      uVar16 = uVar16 + 1;
    } while (iVar17 * iVar17 + (uint)(iVar17 * iVar17 == 0) != uVar16);
  }
  ludecomp(pdVar6,iVar17,ipiv);
  minverse(pdVar6,iVar17,ipiv,hess);
  if (0 < p) {
    memcpy(phi,pdVar5,uVar8 << 3);
  }
  if (0 < q) {
    uVar8 = 0;
    do {
      theta[uVar8] = -pdVar5[(long)p + uVar8];
      uVar8 = uVar8 + 1;
    } while ((uint)q != uVar8);
  }
  if (0 < P) {
    uVar8 = 0;
    do {
      PHI[uVar8] = pdVar5[(long)(q + p) + uVar8];
      uVar8 = uVar8 + 1;
    } while ((uint)P != uVar8);
  }
  if (0 < Q) {
    pvVar7 = (void *)0x0;
    do {
      THETA[(long)pvVar7] = -pdVar5[(long)(q + p + P) + (long)pvVar7];
      pvVar7 = (void *)((long)pvVar7 + 1);
    } while (css_min.params != pvVar7);
  }
  if (imean != 1 || iVar9 != d) {
    *wmean = 0.0;
    if (0 < N_00) {
      uVar8 = 0;
      do {
        exog[uVar8] = pdVar5[(long)(q + p + P + Q) + uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar10 != uVar8);
    }
  }
  else {
    lVar12 = (long)(q + p + P + Q);
    *wmean = pdVar5[lVar12];
    if (1 < N_00) {
      lVar13 = 0;
      do {
        exog[lVar13] = pdVar5[lVar12 + lVar13 + 1];
        lVar13 = lVar13 + 1;
      } while (uVar10 - 1 != lVar13);
    }
  }
  *var = __ptr->ssq / (double)__ptr->Nmncond;
  *loglik = __ptr->loglik;
  free(pdVar4);
  free(pdVar5);
  free(oup);
  free(__dest);
  free(A);
  free(oup_00);
  free(pdVar6);
  free(dx);
  free(ipiv);
  if (0 < N_00) {
    free(local_b0);
    free(local_b8);
  }
  free(__ptr);
  return uVar3;
}

Assistant:

int cssx(double *inp, int N, double *xreg, int optmethod, int p, int d, int q, int s, int P, int D, int Q,
	double *phi, double *theta, double *PHI, double *THETA,  double *exog, int r, double *wmean, double *var,double *loglik,double *hess,int start,int imean) {
	int i, pq, retval, length, offset,ret,nd,ncxreg,N1,rnk,orig,ERR;
	double *b, *tf, *x, *inp2,*dx,*thess,*x0,*XX,*U,*V,*SIG,*coeff,*sigma,*varcovar,*res;
	int *ipiv;
	double maxstep;
	xlik_css_object obj;
	reg_object fit;

	inp2 = (double*)malloc(sizeof(double)* (N - s*D));

	length = N;

	nd = d + D;
	ncxreg = (xreg == NULL) ? 0 : r;

	maxstep = 1.0;

	if (start == 0) {
		for (i = 0; i < p; ++i) {
			phi[i] = 0.0;
		}
		for (i = 0; i < q; ++i) {
			theta[p + i] = 0.0;
		}
		for (i = 0; i < P; ++i) {
			PHI[p + q + i] = 0.0;
		}
		for (i = 0; i < Q; ++i) {
			THETA[p + q + P + i] = 0.0;
		}
	}

	/*

	*/

	if (D > 0) {
		N = diffs(inp, N, D, s, inp2);
	}
	else {
		for (i = 0; i < N; ++i) {
			inp2[i] = inp[i];
		}
	}

	x = (double*)malloc(sizeof(double)* (N - d));

	if (d > 0) {
		N = diff(inp2, N, d, x); // No need to demean x
	}
	else {
		for (i = 0; i < N; ++i) {
			x[i] = inp2[i];
		}
	}

	x0 = (double*) malloc(sizeof(double)*length*(r+1));

	if (nd == 0 && imean == 1) {
		for(i = 0; i < length;++i) {
			x0[i] = 1.0;
		}
		if (r > 0) {
			memcpy(x0+length,xreg,sizeof(double)*r*length);
		}
		ncxreg++;
	} else {
		if (ncxreg > 0) {
			memcpy(x0,xreg,sizeof(double)*ncxreg*length);
		}
	}
	XX = (double*) malloc(sizeof(double)*N*(r+1));

	if (ncxreg > 0) {
		N1 = length;
		// x0 differenced and stored back in x0. Also stored in XX
		if (D > 0) {
			N1 = length - s*D;
			for(i = 0; i < ncxreg;++i) {
				diffs(x0+length*i,length,D,s,XX+N1*i);
				memcpy(x0+N1*i,XX+N1*i,sizeof(double)*N1);
			}
		} 
		// x0 differenced to XX
		if (d > 0) {
			for(i = 0; i < ncxreg;++i) {
				diff(x0+N1*i,N1,d,XX+N*i);
			}
		} 
		// Copy x0 to XX
		if (nd == 0) {
			memcpy(XX,x0,sizeof(double)*N*ncxreg);
		}

		rnk = rank(XX,N,ncxreg);

		if (rnk < ncxreg) {
			ERR = 7;
			printf("Exogenous Variables are collinear. \n");
			free(inp2);
			free(x0);
			free(XX);
			free(x);
			return ERR;
		}

	}


	orig = 0;

	if (ncxreg > 0) {
		if (ncxreg == 1) orig = 1;

		fit = reg_init(N,ncxreg);

		varcovar = (double*)malloc(sizeof(double)*ncxreg*ncxreg);
		res = (double*)malloc(sizeof(double)*N);
		coeff = (double*)malloc(sizeof(double)*ncxreg);
		sigma = (double*)malloc(sizeof(double)*ncxreg);


		setIntercept(fit,0);
		regress(fit,XX,x,res,varcovar,0.95);

		for(i = 0; i < ncxreg;++i) {
			coeff[i] = (fit->beta+i)->value;
			sigma[i] = 10.0 * (fit->beta+i)->stdErr;
		}


		free(varcovar);
		free(res);
		free_reg(fit);
	}


	obj = xlik_css_init(p, d, q, s, P, D, Q, ncxreg, N);

	pq = obj->pq;
	b = (double*)malloc(sizeof(double)* pq);
	tf = (double*)malloc(sizeof(double)* pq);
	thess = (double*)malloc(sizeof(double)* pq*pq);
	dx = (double*)malloc(sizeof(double)* pq);
	ipiv = (int*)malloc(sizeof(int)* pq);

	obj->N = N;

	offset = obj->offset;
	// Test

	for (i = 0; i < p; ++i) {
		b[i] = phi[i];
	}
	for (i = 0; i < q; ++i) {
		b[p + i] = -theta[i];
	}
	for (i = 0; i < P; ++i) {
		b[p + q + i] = PHI[i];
	}
	for (i = 0; i < Q; ++i) {
		b[p + q + P + i] = -THETA[i];
	}

	if (ncxreg > 0) {
		for(i = 0; i < ncxreg;++i) {
			b[p + q + P + Q + i] = coeff[i]; // exog
		}
	} else {
		obj->mean = 0.0;
	}

	

	//mdisplay(b, 1, p + q + P + Q);

	for (i = 0; i < N; ++i) {
		obj->x[offset + i] = obj->x[offset + 2 * N + i] = x[i];
	}
	for (i = N; i < 2 * N; ++i) {
		obj->x[offset + i] = 0.0;
	}

	if (ncxreg > 0) {
		for(i = 3 * N; i < (3 + ncxreg)*N; ++i) {
			obj->x[offset + i] = XX[i - 3*N];
		}
	}

	custom_function css_min = { fcssx, obj };
	retval = fminunc(&css_min, NULL, pq, b, maxstep, optmethod, tf);
	if (retval == 0) {
		ret = 0;
	}
	else if (retval == 15) {
		ret = 15;
	}
	else if (retval == 4) {
		ret = 4;
	}
	else {
		ret = 1;
	}

	for (i = 0; i < pq - ncxreg; ++i) {
		dx[i] = 1.0;
	}
	
	for(i = 0; i < ncxreg; ++i) {
		dx[pq - ncxreg + i] = sigma[i];
	}
	

	hessian_fd(&css_min, tf, pq, dx, obj->eps, hess);

	mtranspose(hess, pq, pq, thess);

	for (i = 0; i < pq*pq; ++i) {
		thess[i] = (N - d - s*D) * 0.5 * (hess[i] + thess[i]);
	}


	ludecomp(thess, pq, ipiv);
	minverse(thess, pq, ipiv, hess);

	for (i = 0; i < p; ++i) {
		phi[i] = tf[i];
	}
	for (i = 0; i < q; ++i) {
		theta[i] = -tf[p + i];
	}
	for (i = 0; i < P; ++i) {
		PHI[i] = tf[p + q + i];
	}
	for (i = 0; i < Q; ++i) {
		THETA[i] = -tf[p + q + P + i];
	}

	if (nd == 0 && imean == 1) {
		*wmean = tf[p + q + Q + P];
		if (ncxreg > 1) {
			for(i = 1; i < ncxreg;++i) {
				exog[i-1] = tf[p + q + Q + P + i];
			}
		}
	} else {
		*wmean = 0.0;
		for(i = 0; i < ncxreg; ++i) {
			exog[i] = tf[p + q + Q + P + i];
		}
	}
	
	/*
	wmean = 0.0;
	for (i = 0; i < N; ++i) {
	wmean += (obj->x[N + i] * obj->x[N + i]);
	}*/

	*var = (obj->ssq) / (double) obj->Nmncond;
	//*var = (obj->ssq) / (double) N;
	*loglik = obj->loglik;
	
	free(b);
	free(tf);
	free(inp2);
	free(x0);
	free(XX); 
	free(x);
	free(thess);
	free(dx);
	free(ipiv);
	if (ncxreg > 0) {
		free(coeff);
		free(sigma);
	}
	free_xlik_css(obj);
	return ret;
}